

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticpyramid.cpp
# Opt level: O3

int __thiscall pzgeom::TPZQuadraticPyramid::ClassId(TPZQuadraticPyramid *this)

{
  uint uVar1;
  int iVar2;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TPZQuadraticPyramid","");
  uVar1 = Hash(&local_40);
  iVar2 = TPZNodeRep<13,_pztopology::TPZPyramid>::ClassId
                    (&this->super_TPZNodeRep<13,_pztopology::TPZPyramid>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZQuadraticPyramid::ClassId() const{
    return Hash("TPZQuadraticPyramid") ^ TPZNodeRep<13,pztopology::TPZPyramid>::ClassId() << 1;
}